

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O0

void __thiscall
CGL::RaytracedRenderer::save_image(RaytracedRenderer *this,string *filename,ImageBuffer *buffer)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined8 uVar5;
  long *in_RDX;
  string *in_RSI;
  long *in_RDI;
  size_t i_1;
  size_t i;
  uint32_t *frame_out;
  size_t h;
  size_t w;
  uint32_t *frame;
  stringstream ss;
  tm *lt;
  time_t t;
  time_t rawtime;
  char *in_stack_fffffffffffffd48;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  FILE *__stream;
  ostream *in_stack_fffffffffffffd88;
  ostream *in_stack_fffffffffffffd90;
  ostream *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  string local_238 [32];
  ulong local_218;
  ulong local_210;
  void *local_208;
  ulong local_200;
  long local_1f8;
  reference local_1f0;
  string local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  tm *local_30;
  time_t local_28;
  time_t local_20;
  long *local_18;
  
  if ((int)in_RDI[7] == 4) {
    local_18 = in_RDX;
    if (in_RDX == (long *)0x0) {
      local_18 = in_RDI + 0x1c;
    }
    bVar2 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    if (bVar2) {
      time(&local_20);
      local_28 = time((time_t *)0x0);
      local_30 = localtime(&local_28);
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar3 = std::operator<<(local_1a8,(string *)(in_RDI + 0x50));
      poVar3 = std::operator<<(poVar3,"_screenshot_");
      in_stack_fffffffffffffda0 = (string *)std::ostream::operator<<(poVar3,local_30->tm_mon + 1);
      in_stack_fffffffffffffd98 = std::operator<<((ostream *)in_stack_fffffffffffffda0,"-");
      in_stack_fffffffffffffd90 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd98,local_30->tm_mday);
      in_stack_fffffffffffffd88 = std::operator<<(in_stack_fffffffffffffd90,"_");
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd88,local_30->tm_hour);
      poVar3 = std::operator<<(poVar3,"-");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30->tm_min);
      poVar3 = std::operator<<(poVar3,"-");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30->tm_sec);
      std::operator<<(poVar3,".png");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=(in_RSI,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
    }
    local_1f0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_18 + 2),0);
    local_1f8 = *local_18;
    local_200 = local_18[1];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_1f8 * local_200;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_208 = operator_new__(uVar4);
    for (local_210 = 0; local_210 < local_200; local_210 = local_210 + 1) {
      memcpy((void *)((long)local_208 + local_210 * local_1f8 * 4),
             local_1f0 + ((local_200 - local_210) + -1) * local_1f8,local_1f8 << 2);
    }
    for (local_218 = 0; local_218 < local_1f8 * local_200; local_218 = local_218 + 1) {
      *(uint *)((long)local_208 + local_218 * 4) =
           *(uint *)((long)local_208 + local_218 * 4) | 0xff000000;
    }
    __stream = _stderr;
    uVar5 = std::__cxx11::string::c_str();
    fprintf(__stream,"[PathTracer] Saving to file: %s... ",uVar5);
    lodepng::encode(in_stack_fffffffffffffda0,(uchar *)in_stack_fffffffffffffd98,
                    (uint)((ulong)in_stack_fffffffffffffd90 >> 0x20),(uint)in_stack_fffffffffffffd90
                    ,(LodePNGColorType)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                    (uint)in_stack_fffffffffffffd88);
    fprintf(_stderr,"Done!\n");
    if (local_208 != (void *)0x0) {
      operator_delete__(local_208);
    }
    this_00 = local_238;
    std::__cxx11::string::string(this_00,in_RSI);
    (**(code **)(*in_RDI + 0x78))(in_RDI,this_00);
    std::__cxx11::string::~string(local_238);
  }
  return;
}

Assistant:

void RaytracedRenderer::save_image(string filename, ImageBuffer* buffer) {

  if (state != DONE) return;

  if (!buffer)
    buffer = &frameBuffer;

  if (filename == "") {
    time_t rawtime;
    time (&rawtime);

    time_t t = time(nullptr);
    tm *lt = localtime(&t);
    stringstream ss;
    ss << this->filename << "_screenshot_" << lt->tm_mon+1 << "-" << lt->tm_mday << "_" 
      << lt->tm_hour << "-" << lt->tm_min << "-" << lt->tm_sec << ".png";
    filename = ss.str();  
  }

  uint32_t* frame = &buffer->data[0];
  size_t w = buffer->w;
  size_t h = buffer->h;
  uint32_t* frame_out = new uint32_t[w * h];
  for(size_t i = 0; i < h; ++i) {
    memcpy(frame_out + i * w, frame + (h - i - 1) * w, 4 * w);
  }
  
  for (size_t i = 0; i < w * h; ++i) {
    frame_out[i] |= 0xFF000000;
  }

  fprintf(stderr, "[PathTracer] Saving to file: %s... ", filename.c_str());
  lodepng::encode(filename, (unsigned char*) frame_out, w, h);
  fprintf(stderr, "Done!\n");
  
  delete[] frame_out;

  save_sampling_rate_image(filename);
}